

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

char * get_GLSL_const_array_varname(Context *ctx,int base,int size)

{
  char *pcVar1;
  size_t in_R8;
  char buf [64];
  char acStack_58 [72];
  
  get_GLSL_const_array_varname_in_buf(ctx,base,size,acStack_58,in_R8);
  pcVar1 = StrDup(ctx,acStack_58);
  return pcVar1;
}

Assistant:

static const char *get_GLSL_const_array_varname(Context *ctx, int base, int size)
{
    char buf[64];
    get_GLSL_const_array_varname_in_buf(ctx, base, size, buf, sizeof (buf));
    return StrDup(ctx, buf);
}